

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

pair<perfetto::base::UnixSocketRaw,_perfetto::base::UnixSocketRaw> *
perfetto::base::UnixSocketRaw::CreatePairPosix
          (pair<perfetto::base::UnixSocketRaw,_perfetto::base::UnixSocketRaw>
           *__return_storage_ptr__,SockFamily family,SockType type)

{
  int iVar1;
  int __type;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_74;
  UnixSocketRaw local_70;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_60;
  UnixSocketRaw local_5c;
  UnixSocketRaw local_40;
  UnixSocketRaw local_30;
  int local_20;
  int local_1c;
  int fds [2];
  SockType type_local;
  SockFamily family_local;
  
  fds[0] = type;
  fds[1] = family;
  iVar1 = anon_unknown_0::GetSockFamily(family);
  __type = anon_unknown_0::GetSockType(fds[0]);
  iVar1 = socketpair(iVar1,__type,0,&local_20);
  if (iVar1 == 0) {
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::ScopedResource(&local_60,local_20);
    UnixSocketRaw(&local_5c,&local_60,fds[1],fds[0]);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::ScopedResource(&local_74,local_1c);
    UnixSocketRaw(&local_70,&local_74,fds[1],fds[0]);
    ::std::make_pair<perfetto::base::UnixSocketRaw,perfetto::base::UnixSocketRaw>
              (__return_storage_ptr__,&local_5c,&local_70);
    ~UnixSocketRaw(&local_70);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_74);
    ~UnixSocketRaw(&local_5c);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_60);
  }
  else {
    UnixSocketRaw(&local_30);
    UnixSocketRaw(&local_40);
    ::std::make_pair<perfetto::base::UnixSocketRaw,perfetto::base::UnixSocketRaw>
              (__return_storage_ptr__,&local_30,&local_40);
    ~UnixSocketRaw(&local_40);
    ~UnixSocketRaw(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<UnixSocketRaw, UnixSocketRaw> UnixSocketRaw::CreatePairPosix(
    SockFamily family,
    SockType type) {
  int fds[2];
  if (socketpair(GetSockFamily(family), GetSockType(type), 0, fds) != 0) {
    return std::make_pair(UnixSocketRaw(), UnixSocketRaw());
  }
  return std::make_pair(UnixSocketRaw(ScopedFile(fds[0]), family, type),
                        UnixSocketRaw(ScopedFile(fds[1]), family, type));
}